

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,unsigned_int>::
IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>>::AdvanceIfEnd<2ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul>> *this)

{
  long *plVar1;
  char cVar2;
  undefined8 uVar3;
  
  if (*(long **)(this + 0x40) != *(long **)(this + 0x28)) {
    cVar2 = (**(code **)(**(long **)(this + 0x40) + 0x30))();
    if (cVar2 == '\0') {
      return;
    }
  }
  uVar3 = (**(code **)(**(long **)(this + 0x10) + 0x20))();
  plVar1 = *(long **)(this + 0x40);
  *(undefined8 *)(this + 0x40) = uVar3;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  (**(code **)(**(long **)(this + 0x48) + 0x18))();
  AdvanceIfEnd<1ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }